

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moldudp64.hh
# Opt level: O2

void __thiscall
helix::nasdaq::moldudp64_session<helix::parity::pmd_handler>::subscribe
          (moldudp64_session<helix::parity::pmd_handler> *this,string *symbol,size_t max_orders)

{
  string sStack_38;
  
  std::__cxx11::string::string((string *)&sStack_38,(string *)symbol);
  parity::pmd_handler::subscribe(&this->_handler,&sStack_38,max_orders);
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void moldudp64_session<Handler>::subscribe(const std::string& symbol, size_t max_orders)
{
    _handler.subscribe(symbol, max_orders);
}